

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_rangeproof_rewind
              (secp256k1_context *ctx,uchar *blind_out,uint64_t *value_out,uchar *message_out,
              size_t *outlen,uchar *nonce,uint64_t *min_value,uint64_t *max_value,
              secp256k1_pedersen_commitment *commit,uchar *proof,size_t plen,uchar *extra_commit,
              size_t extra_commit_len,secp256k1_generator *gen)

{
  int iVar1;
  secp256k1_ge genp;
  secp256k1_ge commitp;
  
  if (commit == (secp256k1_pedersen_commitment *)0x0) {
    secp256k1_rangeproof_rewind_cold_10();
  }
  else if (proof == (uchar *)0x0) {
    secp256k1_rangeproof_rewind_cold_9();
  }
  else if (min_value == (uint64_t *)0x0) {
    secp256k1_rangeproof_rewind_cold_8();
  }
  else if (max_value == (uint64_t *)0x0) {
    secp256k1_rangeproof_rewind_cold_7();
  }
  else if (outlen == (size_t *)0x0 || message_out != (uchar *)0x0) {
    if (nonce == (uchar *)0x0) {
      secp256k1_rangeproof_rewind_cold_5();
    }
    else if (extra_commit_len == 0 || extra_commit != (uchar *)0x0) {
      if (gen == (secp256k1_generator *)0x0) {
        secp256k1_rangeproof_rewind_cold_3();
      }
      else if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
        secp256k1_rangeproof_rewind_cold_2();
      }
      else {
        if ((ctx->ecmult_gen_ctx).prec != (secp256k1_ge_storage (*) [64] [16])0x0) {
          secp256k1_pedersen_commitment_load(&commitp,commit);
          secp256k1_fe_set_b32(&genp.x,gen->data);
          secp256k1_fe_set_b32(&genp.y,gen->data + 0x20);
          genp.infinity = 0;
          iVar1 = secp256k1_rangeproof_verify_impl
                            (&ctx->ecmult_ctx,&ctx->ecmult_gen_ctx,blind_out,value_out,message_out,
                             outlen,nonce,min_value,max_value,&commitp,proof,plen,extra_commit,
                             extra_commit_len,&genp);
          return iVar1;
        }
        secp256k1_rangeproof_rewind_cold_1();
      }
    }
    else {
      secp256k1_rangeproof_rewind_cold_4();
    }
  }
  else {
    secp256k1_rangeproof_rewind_cold_6();
  }
  return 0;
}

Assistant:

int secp256k1_rangeproof_rewind(const secp256k1_context* ctx,
 unsigned char *blind_out, uint64_t *value_out, unsigned char *message_out, size_t *outlen, const unsigned char *nonce,
 uint64_t *min_value, uint64_t *max_value,
 const secp256k1_pedersen_commitment *commit, const unsigned char *proof, size_t plen, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_generator* gen) {
    secp256k1_ge commitp;
    secp256k1_ge genp;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(min_value != NULL);
    ARG_CHECK(max_value != NULL);
    ARG_CHECK(message_out != NULL || outlen == NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(extra_commit != NULL || extra_commit_len == 0);
    ARG_CHECK(gen != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    secp256k1_pedersen_commitment_load(&commitp, commit);
    secp256k1_generator_load(&genp, gen);
    return secp256k1_rangeproof_verify_impl(&ctx->ecmult_ctx, &ctx->ecmult_gen_ctx,
     blind_out, value_out, message_out, outlen, nonce, min_value, max_value, &commitp, proof, plen, extra_commit, extra_commit_len, &genp);
}